

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall cubeb_resampler_one_way_Test::TestBody(cubeb_resampler_one_way_Test *this)

{
  uint source_rate;
  uint target_rate;
  long lVar1;
  uint32_t channels;
  uint channels_00;
  uint32_t chunk_duration;
  uint uVar2;
  uint32_t dest_rate;
  long lVar3;
  
  for (channels_00 = 1; channels_00 != 3; channels_00 = channels_00 + 1) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      source_rate = sample_rates[lVar1];
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        target_rate = sample_rates[lVar3];
        for (uVar2 = 10; uVar2 < 0x1e; uVar2 = uVar2 + 10) {
          fprintf(_stderr,
                  "one_way: channels: %d, source_rate: %d, dest_rate: %d, chunk_duration: %d\n",
                  (ulong)channels_00,(ulong)source_rate,(ulong)target_rate,uVar2);
          test_resampler_one_way<float>(channels_00,source_rate,target_rate,(float)(int)uVar2);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, resampler_one_way)
{
  /* Test one way resamplers */
  for (uint32_t channels = 1; channels <= max_channels; channels++) {
    for (uint32_t source_rate = 0; source_rate < array_size(sample_rates);
         source_rate++) {
      for (uint32_t dest_rate = 0; dest_rate < array_size(sample_rates);
           dest_rate++) {
        for (uint32_t chunk_duration = min_chunks; chunk_duration < max_chunks;
             chunk_duration += chunk_increment) {
          fprintf(stderr,
                  "one_way: channels: %d, source_rate: %d, dest_rate: %d, "
                  "chunk_duration: %d\n",
                  channels, sample_rates[source_rate], sample_rates[dest_rate],
                  chunk_duration);
          test_resampler_one_way<float>(channels, sample_rates[source_rate],
                                        sample_rates[dest_rate],
                                        chunk_duration);
        }
      }
    }
  }
}